

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ect.cc
# Opt level: O2

void finish(ect *e)

{
  size_t t;
  ulong uVar1;
  v_array<v_array<unsigned_int>_> *pvVar2;
  long lVar3;
  size_t l;
  ulong uVar4;
  
  for (uVar4 = 0; pvVar2 = (e->all_levels)._begin,
      uVar4 < (ulong)((long)(e->all_levels)._end - (long)pvVar2 >> 5); uVar4 = uVar4 + 1) {
    lVar3 = 0;
    for (uVar1 = 0; uVar1 < (ulong)((long)pvVar2[uVar4]._end - (long)pvVar2[uVar4]._begin >> 5);
        uVar1 = uVar1 + 1) {
      v_array<unsigned_int>::delete_v
                ((v_array<unsigned_int> *)((long)&(pvVar2[uVar4]._begin)->_begin + lVar3));
      pvVar2 = (e->all_levels)._begin;
      lVar3 = lVar3 + 0x20;
    }
    v_array<v_array<unsigned_int>_>::delete_v(pvVar2 + uVar4);
  }
  v_array<v_array<v_array<unsigned_int>_>_>::delete_v(&e->all_levels);
  v_array<unsigned_int>::delete_v(&e->final_nodes);
  v_array<unsigned_long>::delete_v(&e->up_directions);
  v_array<direction>::delete_v(&e->directions);
  v_array<unsigned_long>::delete_v(&e->down_directions);
  v_array<bool>::delete_v(&e->tournaments_won);
  return;
}

Assistant:

void finish(ect& e)
{
  for (size_t l = 0; l < e.all_levels.size(); l++)
  {
    for (size_t t = 0; t < e.all_levels[l].size(); t++) e.all_levels[l][t].delete_v();
    e.all_levels[l].delete_v();
  }
  e.all_levels.delete_v();
  e.final_nodes.delete_v();
  e.up_directions.delete_v();
  e.directions.delete_v();
  e.down_directions.delete_v();
  e.tournaments_won.delete_v();
}